

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O0

size_t Q_GetDim(QMatrix *Q)

{
  LASErrIdType LVar1;
  size_t local_18;
  size_t Dim;
  QMatrix *Q_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    local_18 = Q->Dim;
  }
  else {
    local_18 = 0;
  }
  return local_18;
}

Assistant:

size_t Q_GetDim(QMatrix *Q)
/* returns the dimension of the matrix Q */
{
    size_t Dim;

    if (LASResult() == LASOK)
        Dim = Q->Dim;
    else
        Dim = 0;
    return(Dim);
}